

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O2

Vector<double,_3> * __thiscall
tcu::refract<double,3>
          (Vector<double,_3> *__return_storage_ptr__,tcu *this,Vector<double,_3> *i,
          Vector<double,_3> *n,double eta)

{
  double dVar1;
  double dVar2;
  Vector<double,_3> local_48;
  Vector<double,_3> local_30;
  
  dVar1 = dot<double,3>(i,(Vector<double,_3> *)this);
  dVar2 = 1.0 - eta * eta * (1.0 - dVar1 * dVar1);
  if (0.0 <= dVar2) {
    operator*(&local_48,eta,(Vector<double,_3> *)this);
    if (dVar2 < 0.0) {
      dVar2 = ::sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    operator*(&local_30,eta * dVar1 + dVar2,i);
    operator-(__return_storage_ptr__,&local_48,&local_30);
  }
  else {
    Vector<double,_3>::Vector(__return_storage_ptr__,0.0);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Vector<T, Size> refract (const Vector<T, Size>& i, const Vector<T, Size>& n, T eta)
{
	T cosAngle = dot(n, i);
	T k = T(1) - eta * eta * (T(1) - cosAngle * cosAngle);
	if (k < T(0))
		return Vector<T, Size>(T(0));
	else
		return i * eta - n * T(eta * cosAngle + ::sqrt(k));
}